

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall YAML::SingleDocParser::HandleMap(SingleDocParser *this,EventHandler *eventHandler)

{
  Token *pTVar1;
  EventHandler *eventHandler_00;
  SingleDocParser *in_RSI;
  Scanner *in_RDI;
  EventHandler *in_stack_000000f8;
  SingleDocParser *in_stack_00000100;
  EventHandler *in_stack_00000118;
  SingleDocParser *in_stack_00000120;
  
  pTVar1 = Scanner::peek(in_RDI);
  eventHandler_00 = (EventHandler *)(ulong)(pTVar1->type - BLOCK_MAP_START);
  switch(eventHandler_00) {
  case (EventHandler *)0x0:
    HandleBlockMap(in_stack_00000100,in_stack_000000f8);
    break;
  default:
    break;
  case (EventHandler *)0x5:
    HandleFlowMap(in_stack_00000120,in_stack_00000118);
    break;
  case (EventHandler *)0xa:
    HandleCompactMap(in_RSI,eventHandler_00);
    break;
  case (EventHandler *)0xb:
    HandleCompactMapWithNoKey(in_RSI,eventHandler_00);
  }
  return;
}

Assistant:

void SingleDocParser::HandleMap(EventHandler& eventHandler) {
  // split based on start token
  switch (m_scanner.peek().type) {
    case Token::BLOCK_MAP_START:
      HandleBlockMap(eventHandler);
      break;
    case Token::FLOW_MAP_START:
      HandleFlowMap(eventHandler);
      break;
    case Token::KEY:
      HandleCompactMap(eventHandler);
      break;
    case Token::VALUE:
      HandleCompactMapWithNoKey(eventHandler);
      break;
    default:
      break;
  }
}